

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileLexer.c
# Opt level: O1

cmListFileLexer * cmListFileLexer_New(void)

{
  cmListFileLexer *pcVar1;
  
  pcVar1 = (cmListFileLexer *)malloc(0x68);
  if (pcVar1 == (cmListFileLexer *)0x0) {
    pcVar1 = (cmListFileLexer *)0x0;
  }
  else {
    pcVar1->bracket = 0;
    pcVar1->comment = 0;
    pcVar1->line = 0;
    pcVar1->column = 0;
    pcVar1->string_position = (char *)0x0;
    *(undefined8 *)&pcVar1->string_left = 0;
    pcVar1->cr = 0;
    pcVar1->string_buffer = (char *)0x0;
    *(undefined8 *)&pcVar1->size = 0;
    pcVar1->file = (FILE *)0x0;
    (pcVar1->token).length = 0;
    (pcVar1->token).line = 0;
    *(undefined8 *)&(pcVar1->token).column = 0;
    *(undefined8 *)&pcVar1->token = 0;
    (pcVar1->token).text = (char *)0x0;
    pcVar1->scanner = (yyscan_t)0x0;
    pcVar1->line = 1;
    pcVar1->column = 1;
  }
  return pcVar1;
}

Assistant:

cmListFileLexer* cmListFileLexer_New(void)
{
  cmListFileLexer* lexer = (cmListFileLexer*)malloc(sizeof(cmListFileLexer));
  if (!lexer) {
    return 0;
  }
  memset(lexer, 0, sizeof(*lexer));
  lexer->line = 1;
  lexer->column = 1;
  return lexer;
}